

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::ConstraintPrototypeSyntax::ConstraintPrototypeSyntax
          (ConstraintPrototypeSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,TokenList *qualifiers,
          Token keyword,SyntaxList<slang::syntax::ClassSpecifierSyntax> *specifiers,NameSyntax *name
          ,Token semi)

{
  size_t sVar1;
  pointer ppAVar2;
  pointer ppCVar3;
  SyntaxNode *pSVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  long lVar7;
  
  uVar6 = keyword._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.kind = ConstraintPrototype;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar5 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar4 = (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar4;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (attributes->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006dc458;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          ._M_extent._M_extent_value;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       _M_ptr;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006dc3a8;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar7 = 0;
    do {
      *(ConstraintPrototypeSyntax **)(*(long *)((long)ppAVar2 + lVar7) + 8) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  (this->qualifiers).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (qualifiers->super_SyntaxListBase).super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(qualifiers->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar4 = (qualifiers->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->qualifiers).super_SyntaxListBase.super_SyntaxNode.kind =
       (qualifiers->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->qualifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (this->qualifiers).super_SyntaxListBase.super_SyntaxNode.parent = pSVar4;
  (this->qualifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006dc458;
  (this->qualifiers).super_SyntaxListBase.childCount = (qualifiers->super_SyntaxListBase).childCount
  ;
  sVar1 = (qualifiers->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (qualifiers->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_ptr;
  (this->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->qualifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006dc9a8;
  (this->keyword).kind = (short)uVar6;
  (this->keyword).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->keyword).info = keyword.info;
  uVar5 = *(undefined4 *)&(specifiers->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar4 = (specifiers->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->specifiers).super_SyntaxListBase.super_SyntaxNode.kind =
       (specifiers->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->specifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (this->specifiers).super_SyntaxListBase.super_SyntaxNode.parent = pSVar4;
  (this->specifiers).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (specifiers->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->specifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006dc458;
  (this->specifiers).super_SyntaxListBase.childCount = (specifiers->super_SyntaxListBase).childCount
  ;
  sVar1 = (specifiers->super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (this->specifiers).super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>.
  _M_ptr = (specifiers->super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>).
           _M_ptr;
  (this->specifiers).super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar1;
  (this->specifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006dcd00;
  (this->name).ptr = name;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->qualifiers).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  (this->specifiers).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->specifiers).
          super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppCVar3 = (this->specifiers).
              super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar7 = 0;
    do {
      *(ConstraintPrototypeSyntax **)(*(long *)((long)ppCVar3 + lVar7) + 8) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  (name->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  return;
}

Assistant:

ConstraintPrototypeSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, const TokenList& qualifiers, Token keyword, const SyntaxList<ClassSpecifierSyntax>& specifiers, NameSyntax& name, Token semi) :
        MemberSyntax(SyntaxKind::ConstraintPrototype, attributes), qualifiers(qualifiers), keyword(keyword), specifiers(specifiers), name(&name), semi(semi) {
        this->qualifiers.parent = this;
        this->specifiers.parent = this;
        for (auto child : this->specifiers)
            child->parent = this;
        this->name->parent = this;
    }